

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall GenericModelItem::insertColumns(GenericModelItem *this,int column,int count)

{
  int iVar1;
  GenericModelItem **ppGVar2;
  GenericModelItem *pGVar3;
  reference ppGVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong i;
  uint uVar8;
  int iVar9;
  bool bVar10;
  
  iVar1 = this->m_rowCount;
  if (0 < iVar1) {
    iVar9 = this->m_colCount;
    if (iVar9 == 0) {
      iVar1 = iVar1 * count;
      QList<GenericModelItem_*>::reserve(&this->children,(long)iVar1);
      iVar9 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
        iVar9 = 0;
      }
      for (; iVar1 != iVar9; iVar9 = iVar9 + 1) {
        pGVar3 = (GenericModelItem *)operator_new(0x58);
        GenericModelItem(pGVar3,this);
        pGVar3->m_column = iVar9 % count;
        pGVar3->m_row = iVar9 / count;
        QList<GenericModelItem_*>::append(&this->children,pGVar3);
      }
    }
    else {
      uVar8 = (iVar1 + -1) * iVar9 + column;
      uVar6 = 0;
      if (0 < count) {
        uVar6 = (ulong)(uint)count;
      }
      for (; -1 < (int)uVar8; uVar8 = uVar8 - iVar9) {
        iVar1 = (int)(uVar8 - column) / iVar9;
        if (-1 < iVar1) {
          i = (ulong)uVar8;
          ppGVar2 = (this->children).d.ptr + i;
          for (uVar5 = uVar8; (int)uVar5 < (int)(iVar9 + (uVar8 - column)); uVar5 = uVar5 + 1) {
            (*ppGVar2)->m_column = (*ppGVar2)->m_column + count;
            ppGVar2 = ppGVar2 + 1;
          }
          QList<GenericModelItem_*>::insert(&this->children,i,(long)count,(parameter_type)0x0);
          uVar7 = uVar6;
          iVar9 = column;
          while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
            pGVar3 = (GenericModelItem *)operator_new(0x58);
            GenericModelItem(pGVar3,this);
            pGVar3->m_column = iVar9;
            pGVar3->m_row = iVar1;
            ppGVar4 = QList<GenericModelItem_*>::operator[](&this->children,i);
            *ppGVar4 = pGVar3;
            iVar9 = iVar9 + 1;
            i = i + 1;
          }
          iVar9 = this->m_colCount;
        }
      }
    }
  }
  this->m_colCount = this->m_colCount + count;
  return;
}

Assistant:

void GenericModelItem::insertColumns(int column, int count)
{
    if (m_rowCount > 0) {
        if (m_colCount == 0) {
            Q_ASSERT(column == 0);
            Q_ASSERT(children.isEmpty());
            const int childrenSize = count * m_rowCount;
            children.reserve(childrenSize);
            for (int j = 0; j < childrenSize; ++j) {
                auto newChild = new GenericModelItem(this);
                newChild->m_column = j % count;
                newChild->m_row = j / count;
                children.append(newChild);
            }
        } else {
            for (int i = column + (m_colCount * (m_rowCount - 1)); i >= 0; i -= m_colCount) {
                Q_ASSERT((i - column) % m_colCount == 0);
                const int rowIndex = (i - column) / m_colCount;
                if (rowIndex < 0)
                    continue;
                for (int j = i; j < i - column + m_colCount; ++j)
                    children.at(j)->m_column += count;
                children.insert(i, count, nullptr);
                for (int j = 0; j < count; ++j) {
                    auto newChild = new GenericModelItem(this);
                    newChild->m_column = column + j;
                    newChild->m_row = rowIndex;
                    children[i + j] = newChild;
                }
            }
        }
    }
    m_colCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}